

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMemory.c
# Opt level: O2

char * Extra_MmStepEntryFetch(Extra_MmStep_t *p,int nBytes)

{
  void **ppvVar1;
  char *pcVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  
  if (nBytes == 0) {
    pcVar2 = (char *)0x0;
  }
  else {
    if (nBytes <= p->nMapSize) {
      pcVar2 = Extra_MmFixedEntryFetch(p->pMap[nBytes]);
      return pcVar2;
    }
    iVar5 = p->nLargeChunks;
    if (iVar5 == p->nLargeChunksAlloc) {
      iVar4 = 0x40;
      if (iVar5 != 0) {
        iVar4 = iVar5 * 2;
      }
      p->nLargeChunksAlloc = iVar4;
      if (p->pLargeChunks == (void **)0x0) {
        ppvVar1 = (void **)malloc((long)iVar4 << 3);
      }
      else {
        ppvVar1 = (void **)realloc(p->pLargeChunks,(long)iVar4 << 3);
        iVar5 = p->nLargeChunks;
      }
      p->pLargeChunks = ppvVar1;
    }
    else {
      ppvVar1 = p->pLargeChunks;
    }
    pvVar3 = malloc((long)nBytes);
    p->nLargeChunks = iVar5 + 1;
    ppvVar1[iVar5] = pvVar3;
    pcVar2 = (char *)p->pLargeChunks[iVar5];
  }
  return pcVar2;
}

Assistant:

char * Extra_MmStepEntryFetch( Extra_MmStep_t * p, int nBytes )
{
    if ( nBytes == 0 )
        return NULL;
    if ( nBytes > p->nMapSize )
    {
//        printf( "Allocating %d bytes.\n", nBytes );
//        return ABC_ALLOC( char, nBytes );
        if ( p->nLargeChunks == p->nLargeChunksAlloc )
        {
            if ( p->nLargeChunksAlloc == 0 )
                p->nLargeChunksAlloc = 32;
            p->nLargeChunksAlloc *= 2;
            p->pLargeChunks = ABC_REALLOC( void *, p->pLargeChunks, p->nLargeChunksAlloc );
        }
        p->pLargeChunks[ p->nLargeChunks++ ] = ABC_ALLOC( char, nBytes );
        return (char *)p->pLargeChunks[ p->nLargeChunks - 1 ];
    }
    return Extra_MmFixedEntryFetch( p->pMap[nBytes] );
}